

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O3

FT_Error ft_hash_str_init(FT_Hash hash,FT_Memory memory)

{
  FT_Hashnode *__s;
  FT_Error FVar1;
  
  hash->limit = 0x50;
  hash->size = 0xf1;
  hash->used = 0;
  hash->lookup = hash_str_lookup;
  hash->compare = hash_str_compare;
  __s = (FT_Hashnode *)(*memory->alloc)(memory,0x788);
  if (__s == (FT_Hashnode *)0x0) {
    FVar1 = 0x40;
  }
  else {
    FVar1 = 0;
    memset(__s,0,0x788);
  }
  hash->table = __s;
  return FVar1;
}

Assistant:

FT_Error
  ft_hash_str_init( FT_Hash    hash,
                    FT_Memory  memory )
  {
    return hash_init( hash, 0, memory );
  }